

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_containers.cpp
# Opt level: O0

ostream * operator<<(ostream *ostream,RGB rgb)

{
  ostream *poVar1;
  ostream *ostream_local;
  RGB rgb_local;
  
  poVar1 = std::operator<<(ostream,"R=");
  ostream_local._5_1_ = rgb.r;
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)ostream_local._5_1_);
  poVar1 = std::operator<<(poVar1," G=");
  ostream_local._6_1_ = rgb.g;
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)ostream_local._6_1_);
  poVar1 = std::operator<<(poVar1," B=");
  std::ostream::operator<<(poVar1,(uint)rgb.b);
  return ostream;
}

Assistant:

std::ostream& operator<<(std::ostream& ostream, RGB rgb) {

    ostream << "R=" << static_cast<std::uint32_t>(rgb.r) << " G=" << static_cast<std::uint32_t>(rgb.g) << " B=" << static_cast<std::uint32_t>(rgb.b);
    return ostream;
  }